

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.hpp
# Opt level: O0

type boost::phoenix::expression::reference<coapi::code_registry>::make(code_registry *t)

{
  code_registry *t_local;
  type e;
  
  return (expr_type)(expr_type)t;
}

Assistant:

static const type make(T & t)
            {
                typename reference<T>::type const e = {{boost::ref(t)}};
                return e;
            }